

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O3

void __thiscall
helics::apps::Connector::addConnection
          (Connector *this,string_view interface1,string_view interface2,
          InterfaceDirection direction,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *connectionTags)

{
  pointer pbVar1;
  string_view interfaceName;
  string_view interfaceName_00;
  size_t sVar2;
  char *pcVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tag;
  pointer pbVar5;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  string_view tagName;
  string_view iview2;
  string_view iview1;
  basic_string_view<char,_std::char_traits<char>_> __tmp;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_f8;
  string_view local_d8;
  string_view local_c8;
  Connection local_b8;
  size_t local_68;
  char *local_60;
  size_t local_58;
  char *local_50;
  size_t local_48;
  char *pcStack_40;
  
  local_60 = interface2._M_str;
  local_68 = interface2._M_len;
  local_50 = interface1._M_str;
  local_58 = interface1._M_len;
  local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&local_f8,
             (long)(connectionTags->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(connectionTags->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5);
  pbVar5 = (connectionTags->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (connectionTags->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar5 != pbVar1) {
    do {
      tagName._M_str = (pbVar5->_M_dataplus)._M_p;
      tagName._M_len = pbVar5->_M_string_length;
      local_b8.interface1._M_len = addTag(this,tagName);
      if (local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
        _M_realloc_insert<unsigned_long>
                  (&local_f8,
                   (iterator)
                   local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_b8);
      }
      else {
        *local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = local_b8.interface1._M_len;
        local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != pbVar1);
  }
  interfaceName_00._M_str = local_50;
  interfaceName_00._M_len = local_58;
  local_c8 = addInterface(this,interfaceName_00);
  interfaceName._M_str = local_60;
  interfaceName._M_len = local_68;
  local_d8 = addInterface(this,interfaceName);
  this_00 = &local_c8;
  local_b8.interface1._M_len = local_c8._M_len;
  local_b8.interface1._M_str = local_c8._M_str;
  local_b8.interface2._M_len = local_d8._M_len;
  local_b8.interface2._M_str = local_d8._M_str;
  local_b8.tags.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_b8.tags.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_b8.tags.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.stringBuffer.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_b8.stringBuffer.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_b8.direction = direction;
  iVar4 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare(this_00,0,6,"REGEX:");
  pcVar3 = local_b8.interface1._M_str;
  sVar2 = local_b8.interface1._M_len;
  if (iVar4 == 0) {
    if (direction == TO_FROM) {
      local_48 = local_b8.interface1._M_len;
      pcStack_40 = local_b8.interface1._M_str;
      local_b8.interface1._M_len = local_b8.interface2._M_len;
      local_b8.interface1._M_str = local_b8.interface2._M_str;
      local_b8.interface2._M_len = sVar2;
      local_b8.interface2._M_str = pcVar3;
    }
    else if (direction == BIDIRECTIONAL) {
      std::vector<helics::apps::Connection,std::allocator<helics::apps::Connection>>::
      emplace_back<helics::apps::Connection&>
                ((vector<helics::apps::Connection,std::allocator<helics::apps::Connection>> *)
                 &this->matchers,&local_b8);
      pcVar3 = local_b8.interface1._M_str;
      sVar2 = local_b8.interface1._M_len;
      local_48 = local_b8.interface1._M_len;
      pcStack_40 = local_b8.interface1._M_str;
      local_b8.interface1._M_len = local_b8.interface2._M_len;
      local_b8.interface1._M_str = local_b8.interface2._M_str;
      local_b8.interface2._M_len = sVar2;
      local_b8.interface2._M_str = pcVar3;
    }
    else if (direction != FROM_TO) goto LAB_001ef583;
    CLI::std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::
    emplace_back<helics::apps::Connection>(&this->matchers,&local_b8);
    goto LAB_001ef583;
  }
  if (direction != FROM_TO) {
    if (direction == BIDIRECTIONAL) {
      std::
      _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::Connection>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::Connection>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
      ::_M_emplace<std::basic_string_view<char,std::char_traits<char>>&,helics::apps::Connection&>
                ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::Connection>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::Connection>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                  *)&this->connections,0,&local_d8,&local_b8);
      if (local_c8._M_len == local_d8._M_len) {
        if (local_c8._M_len == 0) goto LAB_001ef583;
        iVar4 = bcmp(local_c8._M_str,local_d8._M_str,local_c8._M_len);
        if (iVar4 == 0) goto LAB_001ef583;
      }
    }
    else {
      if (direction != TO_FROM) goto LAB_001ef583;
      this_00 = &local_d8;
    }
  }
  std::
  _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::Connection>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::Connection>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
  ::_M_emplace<std::basic_string_view<char,std::char_traits<char>>&,helics::apps::Connection>
            ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::Connection>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::Connection>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              *)&this->connections,0,this_00,&local_b8);
LAB_001ef583:
  if (local_b8.stringBuffer.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.stringBuffer.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_b8.tags.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.tags.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.tags.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.tags.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Connector::addConnection(std::string_view interface1,
                              std::string_view interface2,
                              InterfaceDirection direction,
                              const std::vector<std::string>& connectionTags)
{
    std::vector<std::size_t> svtags;
    svtags.reserve(connectionTags.size());
    for (const auto& tag : connectionTags) {
        svtags.push_back(addTag(tag));
    }
    auto iview1 = addInterface(interface1);
    auto iview2 = addInterface(interface2);
    Connection conn{iview1, iview2, direction, std::move(svtags), nullptr};
    if (iview1.compare(0, 6, "REGEX:") == 0) {
        switch (direction) {
            case InterfaceDirection::TO_FROM:
                std::swap(conn.interface1, conn.interface2);
                matchers.emplace_back(std::move(conn));
                break;
            case InterfaceDirection::FROM_TO:
                matchers.emplace_back(std::move(conn));
                break;
            case InterfaceDirection::BIDIRECTIONAL:
                matchers.emplace_back(conn);
                std::swap(conn.interface1, conn.interface2);
                matchers.emplace_back(std::move(conn));
                break;
        }
    } else {
        switch (direction) {
            case InterfaceDirection::TO_FROM:
                connections.emplace(iview2, std::move(conn));
                break;
            case InterfaceDirection::FROM_TO:
                connections.emplace(iview1, std::move(conn));
                break;
            case InterfaceDirection::BIDIRECTIONAL:
                connections.emplace(iview2, conn);
                if (iview1 != iview2) {
                    connections.emplace(iview1, std::move(conn));
                }
                break;
        }
    }
}